

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_args.c
# Opt level: O0

int mpt_object_args(mpt_object *obj,mpt_iterator *args)

{
  int iVar1;
  char *pcVar2;
  ulong __n;
  int local_1a0;
  int local_19c;
  int local_190;
  int local_18c;
  size_t len;
  char *str;
  char name [256];
  mpt_convertable *conv;
  undefined8 *puStack_68;
  int res;
  void *ptr;
  undefined8 *puStack_58;
  int count;
  mpt_value *val;
  mpt_property pr;
  mpt_iterator *args_local;
  mpt_object *obj_local;
  
  pr._buf._8_8_ = args;
  memset(&val,0,0x30);
  ptr._4_4_ = 0;
  do {
    puStack_58 = (undefined8 *)(*(code *)**(undefined8 **)pr._buf._8_8_)(pr._buf._8_8_);
    if ((puStack_58 == (undefined8 *)0x0) || (puStack_58 == (undefined8 *)0x0)) {
      return ptr._4_4_;
    }
    val = (mpt_value *)0x0;
    pr.val._addr = (void *)0x0;
    puStack_68 = (undefined8 *)*puStack_58;
    if (((puStack_58[1] == 0x80) || (puStack_58[1] == 0x801)) ||
       ((0xff < (ulong)puStack_58[1] && ((ulong)puStack_58[1] < 0x800)))) {
      name._248_8_ = *puStack_68;
      iVar1 = (*(code *)**(undefined8 **)name._248_8_)(name._248_8_,0x1a,&val);
      if ((iVar1 < 0) ||
         (iVar1 = mpt_object_set_value(obj,(char *)val,(mpt_value *)&pr.desc), iVar1 < 0)) {
        pr.val._addr = (void *)0x0;
        (*(code *)**(undefined8 **)name._248_8_)(name._248_8_,0x73,&val);
      }
    }
    if (pr.val._addr == (void *)0x0) {
      if ((val == (mpt_value *)0x0) &&
         (val = (mpt_value *)mpt_data_tostring(&stack0xffffffffffffff98,puStack_58[1],(size_t *)0x0)
         , val == (mpt_value *)0x0)) {
        if (ptr._4_4_ == 0) {
          local_18c = -2;
        }
        else {
          local_18c = ptr._4_4_;
        }
        return local_18c;
      }
      pcVar2 = strchr((char *)val,0x3d);
      if (pcVar2 == (char *)0x0) {
        pr.val._addr = (void *)0x73;
        pr.val._type = 0;
        pr.desc = (char *)&pr.val._type;
      }
      else {
        pr.val._addr = (void *)0x73;
        pr.val._type = (mpt_type_t)(pcVar2 + 1);
        pr.desc = (char *)&pr.val._type;
        __n = (long)pcVar2 - (long)val;
        if (0xff < __n) {
          if (ptr._4_4_ == 0) {
            local_190 = -0x11;
          }
          else {
            local_190 = ptr._4_4_;
          }
          return local_190;
        }
        memcpy((mpt_value *)&str,val,__n);
        val = (mpt_value *)&str;
        name[__n - 8] = '\0';
      }
      iVar1 = mpt_object_set_value(obj,(char *)val,(mpt_value *)&pr.desc);
      if (iVar1 < 0) {
        if (ptr._4_4_ == 0) {
          local_19c = -2;
        }
        else {
          local_19c = ptr._4_4_;
        }
        return local_19c;
      }
    }
    local_1a0 = (**(code **)(*(long *)pr._buf._8_8_ + 8))(pr._buf._8_8_);
    if (local_1a0 < 1) {
      if (ptr._4_4_ == 0) {
        local_1a0 = ptr._4_4_;
      }
      return local_1a0;
    }
    ptr._4_4_ = ptr._4_4_ + 1;
  } while( true );
}

Assistant:

extern int mpt_object_args(MPT_INTERFACE(object) *obj, MPT_INTERFACE(iterator) *args)
{
	MPT_STRUCT(property) pr = MPT_PROPERTY_INIT;
	const MPT_STRUCT(value) *val;
	int count;
	
	count = 0;
	while ((val = args->_vptr->value(args))) {
		const void *ptr;
		int res;
		
		if (!val) {
			break;
		}
		pr.name = 0;
		pr.val._type = 0;
		ptr = val->_addr;
		if (MPT_type_isConvertable(val->_type)) {
			MPT_INTERFACE(convertable) *conv = *((void * const *) ptr);
			
			if (conv->_vptr->convert(conv, MPT_ENUM(TypeProperty), &pr) < 0
			 || mpt_object_set_value(obj, pr.name, &pr.val) < 0) {
				pr.val._type = 0;
				conv->_vptr->convert(conv, 's', &pr.name);
			}
		}
		/* value is not assigned via property */
		if (!pr.val._type) {
			char name[256];
			const char *str;
			if (!pr.name && !(pr.name = mpt_data_tostring(&ptr, val->_type, 0))) {
				return count ? count : MPT_ERROR(BadValue);
			}
			/* set non-assign options to default value */
			if (!(str = strchr(pr.name, '='))) {
				MPT_property_set_string(&pr, 0);
			} else {
				size_t len;
				MPT_property_set_string(&pr, str + 1);
				len = str - pr.name;
				if (len >= sizeof(name)) {
					return count ? count : MPT_ERROR(MissingBuffer);
				}
				pr.name = memcpy(name, pr.name, len);
				name[len++] = 0;
			}
			/* assign config */
			if (mpt_object_set_value(obj, pr.name, &pr.val) < 0) {
				return count ? count : MPT_ERROR(BadValue);
			}
		}
		if ((res = args->_vptr->advance(args)) <= 0) {
			return count ? res : count;
		}
		++count;
	}
	return count;
}